

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  AActor *pAVar4;
  char *pcVar5;
  uint uVar6;
  bool bVar7;
  void *local_38;
  DAngle local_30;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003da4eb;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003da4db:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003da4eb:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x125e,
                  "int AF_AActor_A_SetAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_003da424;
    pPVar3 = (pAVar4->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(pAVar4->super_DThinker).super_DObject._vptr_DObject)(pAVar4);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (pAVar4->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003da4eb;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_003da4db;
LAB_003da424:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003da53b:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x125f,
                    "int AF_AActor_A_SetAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    local_38 = param[1].field_0.field_1.a;
LAB_003da46f:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003da55a:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1260,
                    "int AF_AActor_A_SetAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar6 = param[2].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\x01') {
      pcVar5 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003da53b;
    }
    local_38 = param[1].field_0.field_1.a;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003da46f;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003da55a;
    }
    uVar6 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003da50a;
      }
      goto LAB_003da488;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003da50a:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1261,
                  "int AF_AActor_A_SetAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003da488:
  pAVar4 = COPY_AAPTR(pAVar4,param[3].field_0.i);
  if (pAVar4 != (AActor *)0x0) {
    local_30.Degrees = (double)local_38;
    AActor::SetAngle(pAVar4,&local_30,SUB41((uVar6 & 2) >> 1,0));
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT_DEF(angle);
	PARAM_INT_DEF(flags);
	PARAM_INT_DEF(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);
	if (ref != NULL)
	{
		ref->SetAngle(angle, !!(flags & SPF_INTERPOLATE));
	}
	return 0;
}